

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OptimizeInstructions.cpp
# Opt level: O2

Index __thiscall
wasm::OptimizeInstructions::getSignExtBits(OptimizeInstructions *this,Expression *curr)

{
  Index IVar1;
  Expression *pEVar2;
  
  pEVar2 = Properties::getSignExtValue(curr);
  if (pEVar2 != (Expression *)0x0) {
    IVar1 = Properties::getSignExtBits(curr);
    return IVar1;
  }
  IVar1 = 0;
  if (curr->_id == LocalGetId) {
    IVar1 = (this->localInfo).super__Vector_base<wasm::LocalInfo,_std::allocator<wasm::LocalInfo>_>.
            _M_impl.super__Vector_impl_data._M_start[*(uint *)(curr + 1)].signExtBits;
  }
  return IVar1;
}

Assistant:

Index getSignExtBits(Expression* curr) {
    if (Properties::getSignExtValue(curr)) {
      return Properties::getSignExtBits(curr);
    }
    if (auto* get = curr->dynCast<LocalGet>()) {
      // Check what we know about the local.
      return localInfo[get->index].signExtBits;
    }
    return 0;
  }